

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  byte local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  size_type pos;
  text *arg_local;
  
  pos = (size_type)arg;
  arg_local = &__return_storage_ptr__->first;
  local_20 = std::__cxx11::string::rfind((char)arg,0x3d);
  local_41 = 0;
  local_79 = 0;
  if (local_20 == -1) {
    std::__cxx11::string::string((string *)&local_40);
    local_41 = 1;
    std::make_pair<std::__cxx11::string&,std::__cxx11::string>(__return_storage_ptr__,arg,&local_40)
    ;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)arg);
    local_79 = 1;
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)arg);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,&local_78,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_79 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}